

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  Descriptor *pDVar3;
  int __c;
  int __c_00;
  int __c_01;
  char *pcVar4;
  value_type_conflict2 local_24;
  value_type_conflict2 local_20;
  value_type_conflict2 local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  FieldDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  bVar2 = is_extension(this);
  if (bVar2) {
    pDVar3 = extension_scope(this);
    if (pDVar3 == (Descriptor *)0x0) {
      pcVar4 = "\a";
      std::vector<int,_std::allocator<int>_>::push_back
                (local_18,&FileDescriptorProto::kExtensionFieldNumber);
      pvVar1 = local_18;
      pcVar4 = index(this,pcVar4,__c);
      local_1c = (value_type_conflict2)pcVar4;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_1c);
    }
    else {
      pDVar3 = extension_scope(this);
      Descriptor::GetLocationPath(pDVar3,local_18);
      pcVar4 = "\x06";
      std::vector<int,_std::allocator<int>_>::push_back
                (local_18,&DescriptorProto::kExtensionFieldNumber);
      pvVar1 = local_18;
      pcVar4 = index(this,pcVar4,__c_00);
      local_20 = (value_type_conflict2)pcVar4;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_20);
    }
  }
  else {
    pDVar3 = containing_type(this);
    Descriptor::GetLocationPath(pDVar3,local_18);
    pcVar4 = "\x02";
    std::vector<int,_std::allocator<int>_>::push_back(local_18,&DescriptorProto::kFieldFieldNumber);
    pvVar1 = local_18;
    pcVar4 = index(this,pcVar4,__c_01);
    local_24 = (value_type_conflict2)pcVar4;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_24);
  }
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == NULL) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}